

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::BuildIntersectList(Clipper *this,long64 botY,long64 topY)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  TEdge *pTVar4;
  TEdge *edge2;
  double dVar5;
  IntPoint local_48;
  
  pTVar4 = this->m_ActiveEdges;
  if (pTVar4 != (TEdge *)0x0) {
    if (pTVar4->ytop == topY) {
      lVar3 = pTVar4->xtop;
    }
    else {
      dVar5 = (double)(topY - pTVar4->ybot) * pTVar4->dx;
      lVar3 = (long)(dVar5 + *(double *)(&DAT_006da1d0 + (ulong)(dVar5 < 0.0) * 8)) + pTVar4->xbot;
    }
    pTVar4->tmpX = lVar3;
    this->m_SortedEdges = pTVar4;
    pTVar4->prevInSEL = (TEdge *)0x0;
    for (pTVar4 = pTVar4->nextInAEL; pTVar4 != (TEdge *)0x0; pTVar4 = pTVar4->nextInAEL) {
      pTVar4->prevInSEL = pTVar4->prevInAEL;
      pTVar4->prevInAEL->nextInSEL = pTVar4;
      pTVar4->nextInSEL = (TEdge *)0x0;
      if (pTVar4->ytop == topY) {
        lVar3 = pTVar4->xtop;
      }
      else {
        dVar5 = (double)(topY - pTVar4->ybot) * pTVar4->dx;
        lVar3 = (long)(dVar5 + *(double *)(&DAT_006da1d0 + (ulong)(dVar5 < 0.0) * 8)) + pTVar4->xbot
        ;
      }
      pTVar4->tmpX = lVar3;
    }
    pTVar4 = this->m_SortedEdges;
    if (pTVar4 != (TEdge *)0x0) {
      do {
        bVar2 = 0;
        for (edge2 = pTVar4->nextInSEL; edge2 != (TEdge *)0x0; edge2 = edge2->nextInSEL) {
          local_48.X = 0;
          local_48.Y = 0;
          if ((edge2->tmpX < pTVar4->tmpX) &&
             (bVar1 = IntersectPoint(pTVar4,edge2,&local_48,
                                     (bool)(this->_vptr_Clipper[-3] + 0x10)
                                           [(long)&(this->m_PolyOuts).
                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                           ]), bVar1)) {
            if (botY < local_48.Y) {
              local_48.Y = botY;
              if (pTVar4->ytop == botY) {
                local_48.X = pTVar4->xtop;
              }
              else {
                dVar5 = (double)(botY - pTVar4->ybot) * pTVar4->dx;
                local_48.X = (long)(dVar5 + *(double *)(&DAT_006da1d0 + (ulong)(dVar5 < 0.0) * 8)) +
                             pTVar4->xbot;
              }
            }
            AddIntersectNode(this,pTVar4,edge2,&local_48);
            SwapPositionsInSEL(this,pTVar4,edge2);
            bVar2 = 1;
            edge2 = pTVar4;
          }
          pTVar4 = edge2;
        }
        if (pTVar4->prevInSEL == (TEdge *)0x0) break;
        pTVar4->prevInSEL->nextInSEL = (TEdge *)0x0;
        pTVar4 = this->m_SortedEdges;
      } while ((bool)(bVar2 & pTVar4 != (TEdge *)0x0));
    }
    this->m_SortedEdges = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::BuildIntersectList(const long64 botY, const long64 topY)
{
  if ( !m_ActiveEdges ) return;

  //prepare for sorting ...
  TEdge* e = m_ActiveEdges;
  e->tmpX = TopX( *e, topY );
  m_SortedEdges = e;
  m_SortedEdges->prevInSEL = 0;
  e = e->nextInAEL;
  while( e )
  {
    e->prevInSEL = e->prevInAEL;
    e->prevInSEL->nextInSEL = e;
    e->nextInSEL = 0;
    e->tmpX = TopX( *e, topY );
    e = e->nextInAEL;
  }

  //bubblesort ...
  bool isModified = true;
  while( isModified && m_SortedEdges )
  {
    isModified = false;
    e = m_SortedEdges;
    while( e->nextInSEL )
    {
      TEdge *eNext = e->nextInSEL;
      IntPoint pt;
      if(e->tmpX > eNext->tmpX &&
        IntersectPoint(*e, *eNext, pt, m_UseFullRange))
      {
        if (pt.Y > botY)
        {
            pt.Y = botY;
            pt.X = TopX(*e, pt.Y);
        }
        AddIntersectNode( e, eNext, pt );
        SwapPositionsInSEL(e, eNext);
        isModified = true;
      }
      else
        e = eNext;
    }
    if( e->prevInSEL ) e->prevInSEL->nextInSEL = 0;
    else break;
  }
  m_SortedEdges = 0;
}